

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O0

bool __thiscall
cmOutputRequiredFilesCommand::InitialPass
          (cmOutputRequiredFilesCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  char *pcVar4;
  FILE *pFVar5;
  undefined1 local_348 [8];
  set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
  visited;
  undefined1 local_310 [8];
  string err;
  string local_2e8;
  FILE *local_2c8;
  FILE *fout;
  cmDependInformation *info;
  string local_2b0;
  undefined1 local_290 [8];
  cmLBDepend md;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmOutputRequiredFilesCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar1 = cmCommand::Disallowed
                    (&this->super_cmCommand,CMP0032,
                     "The output_required_files command should not be called; see CMP0032.");
  if (bVar1) {
    this_local._7_1_ = 1;
    goto LAB_005572ef;
  }
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)param_2_local);
  if (sVar2 != 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_005572ef;
  }
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local,0);
  std::__cxx11::string::operator=((string *)&this->File,(string *)pvVar3);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local,1);
  std::__cxx11::string::operator=((string *)&this->OutputFile,(string *)pvVar3);
  cmLBDepend::cmLBDepend((cmLBDepend *)local_290);
  cmMakeDepend::SetMakefile((cmMakeDepend *)local_290,(this->super_cmCommand).Makefile);
  pcVar4 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b0,pcVar4,(allocator *)((long)&info + 7));
  cmMakeDepend::AddSearchPath((cmMakeDepend *)local_290,&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&info + 7));
  pcVar4 = (char *)std::__cxx11::string::c_str();
  fout = (FILE *)cmMakeDepend::FindDependencies((cmMakeDepend *)local_290,pcVar4);
  if (fout == (FILE *)0x0) {
LAB_005572c5:
    this_local._7_1_ = 1;
    visited._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
  }
  else {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_2e8,pcVar4,(allocator *)(err.field_2._M_local_buf + 0xf));
    pFVar5 = (FILE *)cmsys::SystemTools::Fopen(&local_2e8,"w");
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator((allocator<char> *)(err.field_2._M_local_buf + 0xf));
    local_2c8 = pFVar5;
    if (pFVar5 != (FILE *)0x0) {
      std::
      set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
      ::set((set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
             *)local_348);
      ListDependencies(this,(cmDependInformation *)fout,(FILE *)local_2c8,
                       (set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
                        *)local_348);
      fclose(local_2c8);
      std::
      set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
      ::~set((set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
              *)local_348);
      goto LAB_005572c5;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_310,"Can not open output file: ",
               (allocator *)((long)&visited._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&visited._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    std::__cxx11::string::operator+=((string *)local_310,(string *)&this->OutputFile);
    cmCommand::SetError(&this->super_cmCommand,(string *)local_310);
    this_local._7_1_ = 0;
    visited._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
    std::__cxx11::string::~string((string *)local_310);
  }
  cmLBDepend::~cmLBDepend((cmLBDepend *)local_290);
LAB_005572ef:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmOutputRequiredFilesCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(this->Disallowed(cmPolicies::CMP0032,
      "The output_required_files command should not be called; see CMP0032."))
    { return true; }
  if(args.size() != 2 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  // store the arg for final pass
  this->File = args[0];
  this->OutputFile = args[1];

  // compute the list of files
  cmLBDepend md;
  md.SetMakefile(this->Makefile);
  md.AddSearchPath(this->Makefile->GetCurrentSourceDirectory());
  // find the depends for a file
  const cmDependInformation *info = md.FindDependencies(this->File.c_str());
  if (info)
    {
    // write them out
    FILE *fout = cmsys::SystemTools::Fopen(this->OutputFile.c_str(),"w");
    if(!fout)
      {
      std::string err = "Can not open output file: ";
      err += this->OutputFile;
      this->SetError(err);
      return false;
      }
    std::set<cmDependInformation const*> visited;
    this->ListDependencies(info,fout, &visited);
    fclose(fout);
    }

  return true;
}